

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_7::Validator::CheckFuncTypeVar(Validator *this,Var *var,FuncType **out_func_type)

{
  Result RVar1;
  Enum EVar2;
  uint local_1c [2];
  Index index;
  
  RVar1 = CheckVar(this,(Index)((ulong)((long)(this->current_module_->func_types).
                                              super__Vector_base<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(this->current_module_->func_types).
                                             super__Vector_base<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3),var,
                   "function type",local_1c);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    EVar2 = Ok;
    if (out_func_type != (FuncType **)0x0) {
      *out_func_type =
           (this->current_module_->func_types).
           super__Vector_base<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>._M_impl.
           super__Vector_impl_data._M_start[local_1c[0]];
      EVar2 = Ok;
    }
  }
  return (Result)EVar2;
}

Assistant:

Result Validator::CheckFuncTypeVar(const Var* var,
                                   const FuncType** out_func_type) {
  Index index;
  CHECK_RESULT(CheckVar(current_module_->func_types.size(), var,
                        "function type", &index));
  if (out_func_type) {
    *out_func_type = current_module_->func_types[index];
  }
  return Result::Ok;
}